

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void tcu::anon_unknown_74::intToChannel(deUint8 *dst,int src,ChannelType type)

{
  deFloat16 dVar1;
  int iVar2;
  deUint8 dVar3;
  undefined2 uVar4;
  int iVar5;
  
  switch(type) {
  case SNORM_INT8:
  case SIGNED_INT8:
    iVar2 = 0x7f;
    if (src < 0x7f) {
      iVar2 = src;
    }
    dVar3 = 0x80;
    if (-0x80 < iVar2) {
      dVar3 = (deUint8)iVar2;
    }
    goto LAB_009670be;
  case SNORM_INT16:
  case SIGNED_INT16:
    iVar2 = 0x7fff;
    if (src < 0x7fff) {
      iVar2 = src;
    }
    uVar4 = 0x8000;
    if (-0x8000 < iVar2) {
      uVar4 = (undefined2)iVar2;
    }
    goto LAB_00967072;
  case UNORM_INT8:
    iVar2 = 0xff;
    if ((uint)src < 0xff) {
      iVar2 = src;
    }
    dVar3 = '\0';
    if (-1 < src) {
      dVar3 = (deUint8)iVar2;
    }
LAB_009670be:
    *dst = dVar3;
    break;
  case UNORM_INT16:
    iVar2 = 0xffff;
    if ((uint)src < 0xffff) {
      iVar2 = src;
    }
    uVar4 = 0;
    if (-1 < src) {
      uVar4 = (undefined2)iVar2;
    }
LAB_00967072:
    *(undefined2 *)dst = uVar4;
    break;
  case UNORM_INT24:
    iVar5 = 0xffffff;
    if ((uint)src < 0xffffff) {
      iVar5 = src;
    }
    iVar2 = 0;
    if (-1 < src) {
      iVar2 = iVar5;
    }
    goto LAB_00967088;
  case SIGNED_INT32:
  case UNSIGNED_INT32:
    *(int *)dst = src;
    break;
  case UNSIGNED_INT8:
    iVar2 = 0xff;
    if ((uint)src < 0xff) {
      iVar2 = src;
    }
    *dst = (deUint8)iVar2;
    break;
  case UNSIGNED_INT16:
    iVar2 = 0xffff;
    if ((uint)src < 0xffff) {
      iVar2 = src;
    }
    *(short *)dst = (short)iVar2;
    break;
  case UNSIGNED_INT24:
    iVar2 = 0xffffff;
    if ((uint)src < 0xffffff) {
      iVar2 = src;
    }
LAB_00967088:
    *dst = (deUint8)iVar2;
    dst[1] = (deUint8)((uint)iVar2 >> 8);
    dst[2] = (deUint8)((uint)iVar2 >> 0x10);
    break;
  case HALF_FLOAT:
    dVar1 = deFloat32To16((float)src);
    *(deFloat16 *)dst = dVar1;
    break;
  case FLOAT:
    *(float *)dst = (float)src;
    break;
  case FLOAT64:
    *(double *)dst = (double)src;
  }
  return;
}

Assistant:

void intToChannel (deUint8* dst, int src, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			*((deInt8*)dst)			= convertSat<deInt8>	(src);				break;
		case TextureFormat::SNORM_INT16:		*((deInt16*)dst)		= convertSat<deInt16>	(src);				break;
		case TextureFormat::UNORM_INT8:			*((deUint8*)dst)		= convertSat<deUint8>	(src);				break;
		case TextureFormat::UNORM_INT16:		*((deUint16*)dst)		= convertSat<deUint16>	(src);				break;
		case TextureFormat::UNORM_INT24:		writeUint24(dst,		  convertSatUint24		(src));				break;
		case TextureFormat::SIGNED_INT8:		*((deInt8*)dst)			= convertSat<deInt8>	(src);				break;
		case TextureFormat::SIGNED_INT16:		*((deInt16*)dst)		= convertSat<deInt16>	(src);				break;
		case TextureFormat::SIGNED_INT32:		*((deInt32*)dst)		= convertSat<deInt32>	(src);				break;
		case TextureFormat::UNSIGNED_INT8:		*((deUint8*)dst)		= convertSat<deUint8>	((deUint32)src);	break;
		case TextureFormat::UNSIGNED_INT16:		*((deUint16*)dst)		= convertSat<deUint16>	((deUint32)src);	break;
		case TextureFormat::UNSIGNED_INT24:		writeUint24(dst,		  convertSatUint24		((deUint32)src));	break;
		case TextureFormat::UNSIGNED_INT32:		*((deUint32*)dst)		= convertSat<deUint32>	((deUint32)src);	break;
		case TextureFormat::HALF_FLOAT:			*((deFloat16*)dst)		= deFloat32To16((float)src);				break;
		case TextureFormat::FLOAT:				*((float*)dst)			= (float)src;								break;
		case TextureFormat::FLOAT64:			*((double*)dst)			= (double)src;								break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}